

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::multalpha
               (void *data,int npixels,DataType dt,int nchannels,int alphachan)

{
  int in_ECX;
  float in_EDX;
  int in_ESI;
  float *in_RDI;
  int in_R8D;
  float scale_00;
  PtexHalf *unaff_retaddr;
  float scale;
  
  scale_00 = OneValueInv((DataType)in_EDX);
  switch(in_EDX) {
  case 0.0:
    anon_unknown_1::multalpha<unsigned_char>((uchar *)in_RDI,in_ESI,in_ECX,in_R8D,scale_00);
    break;
  case 1.4013e-45:
    anon_unknown_1::multalpha<unsigned_short>
              ((unsigned_short *)in_RDI,in_ESI,in_ECX,in_R8D,scale_00);
    break;
  case 2.8026e-45:
    anon_unknown_1::multalpha<Ptex::v2_4::PtexHalf>
              (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_EDX);
    break;
  case 4.2039e-45:
    anon_unknown_1::multalpha<float>(in_RDI,in_ESI,in_ECX,in_R8D,scale_00);
  }
  return;
}

Assistant:

void multalpha(void* data, int npixels, DataType dt, int nchannels, int alphachan)
{
    float scale = OneValueInv(dt);
    switch(dt) {
    case dt_uint8:    multalpha(static_cast<uint8_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_uint16:   multalpha(static_cast<uint16_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_half:     multalpha(static_cast<PtexHalf*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_float:    multalpha(static_cast<float*>(data), npixels, nchannels, alphachan, scale); break;
    }
}